

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::~QFileDialog(QFileDialog *this)

{
  QFileDialogPrivate *this_00;
  QPlatformDialogHelper *sender;
  
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_007db860;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QFileDialog_007dba38;
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QFileDialogPrivate::saveSettings(this_00);
  sender = QDialogPrivate::platformHelper(&this_00->super_QDialogPrivate);
  if (sender != (QPlatformDialogHelper *)0x0) {
    QObjectPrivate::
    disconnect<void(QPlatformFileDialogHelper::*)(QUrl_const&),void(QFileDialogPrivate::*)(QUrl_const&)>
              ((Object *)sender,
               (offset_in_QPlatformFileDialogHelper_to_subr)
               QPlatformFileDialogHelper::directoryEntered,(Object *)0x0,(Function)this_00);
  }
  QDialog::~QDialog(&this->super_QDialog);
  return;
}

Assistant:

QFileDialog::~QFileDialog()
{
    Q_D(QFileDialog);
#if QT_CONFIG(settings)
    d->saveSettings();
#endif
    if (QPlatformFileDialogHelper *platformHelper = d->platformFileDialogHelper()) {
        // QIOSFileDialog emits directoryChanged while hiding, causing an assert
        // because of a partially destroyed QFileDialog.
        QObjectPrivate::disconnect(platformHelper, &QPlatformFileDialogHelper::directoryEntered,
                                   d, &QFileDialogPrivate::nativeEnterDirectory);
    }
}